

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Match.hpp
# Opt level: O2

int __thiscall xercesc_4_0::Match::getStartPos(Match *this,int index)

{
  ArrayIndexOutOfBoundsException *this_00;
  pointer_____offset_0x10___ *ppuVar1;
  
  if (this->fStartPositions == (int *)0x0) {
    this_00 = (ArrayIndexOutOfBoundsException *)__cxa_allocate_exception(0x30);
    RuntimeException::RuntimeException
              ((RuntimeException *)this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/regx/Match.hpp"
               ,0x75,Regex_Result_Not_Set,this->fMemoryManager);
    ppuVar1 = &RuntimeException::typeinfo;
  }
  else {
    if ((-1 < index) && (index < this->fNoGroups)) {
      return this->fStartPositions[(uint)index];
    }
    this_00 = (ArrayIndexOutOfBoundsException *)__cxa_allocate_exception(0x30);
    ArrayIndexOutOfBoundsException::ArrayIndexOutOfBoundsException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/regx/Match.hpp"
               ,0x78,Array_BadIndex,this->fMemoryManager);
    ppuVar1 = &ArrayIndexOutOfBoundsException::typeinfo;
  }
  __cxa_throw(this_00,ppuVar1,XMLException::~XMLException);
}

Assistant:

inline int Match::getStartPos(int index) const {

    if (!fStartPositions)
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Regex_Result_Not_Set, fMemoryManager);

    if (index < 0 || fNoGroups <= index)
        ThrowXMLwithMemMgr(ArrayIndexOutOfBoundsException, XMLExcepts::Array_BadIndex, fMemoryManager);

    return fStartPositions[index];
}